

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<float,_duckdb::ModeStandard<float>_>::ModeAdd
          (ModeState<float,_duckdb::ModeStandard<float>_> *this,idx_t row)

{
  float *pfVar1;
  mapped_type *pmVar2;
  __buckets_ptr pp_Var3;
  unsigned_long uVar4;
  float *pfVar5;
  unsigned_long in_RSI;
  unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
  *in_RDI;
  size_t new_count;
  mapped_type *attr;
  float *key;
  key_type *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd8;
  ModeState<float,_duckdb::ModeStandard<float>_> *in_stack_ffffffffffffffe0;
  
  pfVar1 = GetCell(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar2 = std::
           unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
           ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  pp_Var3 = (__buckets_ptr)(pmVar2->count + 1);
  pmVar2->count = (size_t)pp_Var3;
  if (pp_Var3 == (__buckets_ptr)0x1) {
    (in_RDI->_M_h)._M_rehash_policy._M_next_resize =
         (in_RDI->_M_h)._M_rehash_policy._M_next_resize + 1;
    pmVar2->first_row = in_RSI;
  }
  else {
    uVar4 = MinValue<unsigned_long>(in_RSI,pmVar2->first_row);
    pmVar2->first_row = uVar4;
  }
  if (in_RDI[1]._M_h._M_buckets < pp_Var3) {
    *(undefined1 *)&(in_RDI->_M_h)._M_single_bucket = 1;
    in_RDI[1]._M_h._M_buckets = pp_Var3;
    if (*(long *)&(in_RDI->_M_h)._M_rehash_policy == 0) {
      pfVar5 = (float *)operator_new(4);
      *pfVar5 = *pfVar1;
      *(float **)&(in_RDI->_M_h)._M_rehash_policy = pfVar5;
    }
    else {
      **(float **)&(in_RDI->_M_h)._M_rehash_policy = *pfVar1;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}